

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeString::allocate(UnicodeString *this,int32_t capacity)

{
  ulong s;
  undefined4 *puVar1;
  int32_t *array;
  size_t numBytes;
  int32_t capacity_local;
  UnicodeString *this_local;
  
  if (capacity < 0x1c) {
    (this->fUnion).fStackFields.fLengthAndFlags = 2;
    this_local._7_1_ = '\x01';
  }
  else {
    if (capacity < 0x7ffffff6) {
      s = (long)(capacity + 1) * 2 + 0x13U & 0xfffffffffffffff0;
      puVar1 = (undefined4 *)uprv_malloc_63(s);
      if (puVar1 != (undefined4 *)0x0) {
        *puVar1 = 1;
        (this->fUnion).fFields.fArray = (char16_t *)(puVar1 + 1);
        (this->fUnion).fFields.fCapacity = (int32_t)(s - 4 >> 1);
        (this->fUnion).fStackFields.fLengthAndFlags = 4;
        return '\x01';
      }
    }
    (this->fUnion).fStackFields.fLengthAndFlags = 1;
    (this->fUnion).fFields.fArray = (char16_t *)0x0;
    (this->fUnion).fFields.fCapacity = 0;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
UnicodeString::allocate(int32_t capacity) {
  if(capacity <= US_STACKBUF_SIZE) {
    fUnion.fFields.fLengthAndFlags = kShortString;
    return TRUE;
  }
  if(capacity <= kMaxCapacity) {
    ++capacity;  // for the NUL
    // Switch to size_t which is unsigned so that we can allocate up to 4GB.
    // Reference counter + UChars.
    size_t numBytes = sizeof(int32_t) + (size_t)capacity * U_SIZEOF_UCHAR;
    // Round up to a multiple of 16.
    numBytes = (numBytes + 15) & ~15;
    int32_t *array = (int32_t *) uprv_malloc(numBytes);
    if(array != NULL) {
      // set initial refCount and point behind the refCount
      *array++ = 1;
      numBytes -= sizeof(int32_t);

      // have fArray point to the first UChar
      fUnion.fFields.fArray = (UChar *)array;
      fUnion.fFields.fCapacity = (int32_t)(numBytes / U_SIZEOF_UCHAR);
      fUnion.fFields.fLengthAndFlags = kLongString;
      return TRUE;
    }
  }
  fUnion.fFields.fLengthAndFlags = kIsBogus;
  fUnion.fFields.fArray = 0;
  fUnion.fFields.fCapacity = 0;
  return FALSE;
}